

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::writeTarget
          (DeferredThirdPartyClient *this,Builder target)

{
  RpcConnectionState *cap;
  DeferredThirdPartyClient *in_RSI;
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> MVar1;
  
  cap = (in_RSI->super_RpcClient).connectionState.ptr;
  ensureAccepted(in_RSI);
  MVar1 = RpcConnectionState::writeTarget((RpcConnectionState *)this,(ClientHook *)cap,target);
  MVar1.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>)MVar1.ptr;
}

Assistant:

kj::Maybe<kj::Own<ClientHook>> writeTarget(
        rpc::MessageTarget::Builder target) override {
      // Someone is addressing a message to this capability. We probably need to accept it and
      // have them address the accepted capability instead.
      return connectionState->writeTarget(ensureAccepted(), target);
    }